

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lite_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::ParseVarintTest_Varint64_Test::TestBody::anon_class_1_0_00000001::
operator()(anon_class_1_0_00000001 *this,uint64_t value,int varint_length)

{
  bool bVar1;
  int i;
  long lVar2;
  byte *pbVar3;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var4;
  anon_class_1_0_00000001 *paVar5;
  char *pcVar6;
  pair<const_char_*,_unsigned_long> pVar7;
  uint64_t parsed;
  AssertionResult gtest_ar;
  uint8_t buffer [10];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_50;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_48;
  internal local_40 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  AssertHelper local_30;
  int local_24;
  byte local_20 [16];
  anon_class_1_0_00000001 *local_10;
  
  local_24 = (int)value;
  local_20[8] = 0;
  local_20[9] = 0;
  local_20[0] = 0;
  local_20[1] = 0;
  local_20[2] = 0;
  local_20[3] = 0;
  local_20[4] = 0;
  local_20[5] = 0;
  local_20[6] = 0;
  local_20[7] = 0;
  pbVar3 = local_20;
  local_10 = this;
  if ((anon_class_1_0_00000001 *)0x7f < this) {
    pbVar3 = local_20;
    paVar5 = this;
    do {
      *pbVar3 = (byte)paVar5 | 0x80;
      this = (anon_class_1_0_00000001 *)((ulong)paVar5 >> 7);
      pbVar3 = pbVar3 + 1;
      bVar1 = (anon_class_1_0_00000001 *)0x3fff < paVar5;
      paVar5 = this;
    } while (bVar1);
  }
  *pbVar3 = (byte)this;
  local_48._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (pbVar3 + (1 - (long)local_20));
  testing::internal::CmpHelperEQ<long,int>
            (local_40,"p - buffer","varint_length",(long *)&local_48,&local_24);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_48._M_head_impl + 0x10),"Value = ",8);
    std::ostream::_M_insert<unsigned_long>((ulong)(local_48._M_head_impl + 0x10));
    if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (local_38->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
               ,0x8d,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
    _Var4._M_head_impl = local_48._M_head_impl;
  }
  else {
    if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_38,local_38);
    }
    local_48._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)~(ulong)local_10
    ;
    lVar2 = 0;
    do {
      lVar2 = lVar2 + 1;
    } while (lVar2 != 10);
    if ((long)(char)local_20[0] < 0) {
      pVar7 = internal::VarintParseSlow64((char *)local_20,(uint)local_20[0]);
    }
    else {
      pVar7.second = (long)(char)local_20[0];
      pVar7.first = (char *)(local_20 + 1);
    }
    local_48._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)pVar7.second;
    local_50._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (pVar7.first + -(long)local_20);
    testing::internal::CmpHelperEQ<long,int>
              (local_40,"r - cbuffer","varint_length",(long *)&local_50,&local_24);
    if (local_40[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_50);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_50._M_head_impl + 0x10),"Value = ",8);
      std::ostream::_M_insert<unsigned_long>((ulong)(local_50._M_head_impl + 0x10));
      if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = (local_38->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_30,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
                 ,0x92,pcVar6);
      testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_50);
    }
    else {
      if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_38,local_38);
      }
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                (local_40,"parsed","value",(unsigned_long *)&local_48,(unsigned_long *)&local_10);
      if (local_40[0] != (internal)0x0) goto LAB_001643c2;
      testing::Message::Message((Message *)&local_50);
      if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = (local_38->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_30,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
                 ,0x93,pcVar6);
      testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_50);
    }
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    _Var4._M_head_impl = local_50._M_head_impl;
  }
  if (_Var4._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)_Var4._M_head_impl + 8))();
  }
LAB_001643c2:
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  return;
}

Assistant:

TEST(ParseVarintTest, Varint64) {
  auto test_value = [](uint64_t value, int varint_length) {
    uint8_t buffer[10] = {0};
    uint8_t* p = io::CodedOutputStream::WriteVarint64ToArray(value, buffer);
    ASSERT_EQ(p - buffer, varint_length) << "Value = " << value;

    const char* cbuffer = reinterpret_cast<const char*>(buffer);
    uint64_t parsed = ~value;
    const char* r = internal::VarintParse(cbuffer, &parsed);
    ASSERT_EQ(r - cbuffer, varint_length) << "Value = " << value;
    ASSERT_EQ(parsed, value);
  };

  uint64_t base = 73;  // 1001011b
  for (int varint_length = 1; varint_length <= 10; ++varint_length) {
    uint64_t values[] = {
        base - 73, base - 72, base, base + 126 - 73, base + 126 - 72,
    };
    for (uint64_t value : values) {
      test_value(value, varint_length);
    }
    base = (base << 7) + 73;
  }

  test_value(std::numeric_limits<uint64_t>::max(), 10);
}